

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExternalFunction.cpp
# Opt level: O0

void __thiscall
Js::JavascriptExternalFunction::JavascriptExternalFunction
          (JavascriptExternalFunction *this,DynamicType *type,InitializeMethod method,
          unsigned_short deferredSlotCount,bool accessors)

{
  nullptr_t local_38;
  nullptr_t local_30;
  byte local_23;
  unsigned_short local_22;
  bool accessors_local;
  InitializeMethod p_Stack_20;
  unsigned_short deferredSlotCount_local;
  InitializeMethod method_local;
  DynamicType *type_local;
  JavascriptExternalFunction *this_local;
  
  local_23 = accessors;
  local_22 = deferredSlotCount;
  p_Stack_20 = method;
  method_local = (InitializeMethod)type;
  type_local = (DynamicType *)this;
  RuntimeFunction::RuntimeFunction
            (&this->super_RuntimeFunction,type,
             (FunctionInfo *)EntryInfo::DefaultExternalFunctionThunk);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01e05978;
  this->flags = 0;
  local_30 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->signature,&local_30);
  local_38 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->callbackState,&local_38);
  (this->field_3).nativeMethod = (Type)0x0;
  Memory::WriteBarrierPtr<int_(void_*)>::WriteBarrierPtr
            (&this->initMethod,(_func_int_void_ptr *)p_Stack_20);
  *(uint *)&this->field_0x68 = *(uint *)&this->field_0x68 & 0xfffffffe | 1;
  *(uint *)&this->field_0x68 = *(uint *)&this->field_0x68 & 0xffff0001 | (local_22 & 0x7fff) << 1;
  *(uint *)&this->field_0x68 =
       *(uint *)&this->field_0x68 & 0xfffeffff | (uint)(local_23 & 1) << 0x10;
  *(uint *)&this->field_0x68 = *(uint *)&this->field_0x68 & 0xffffff;
  JavascriptFunction::VerifyEntryPoint((JavascriptFunction *)this);
  return;
}

Assistant:

JavascriptExternalFunction::JavascriptExternalFunction(DynamicType* type, InitializeMethod method, unsigned short deferredSlotCount, bool accessors)
        : RuntimeFunction(type, &EntryInfo::DefaultExternalFunctionThunk), nativeMethod(nullptr), signature(nullptr), callbackState(nullptr), initMethod(method),
        oneBit(1), typeSlots(deferredSlotCount), hasAccessors(accessors), flags(0), deferredLength(0)
    {
        DebugOnly(VerifyEntryPoint());
    }